

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t __thiscall google::protobuf::internal::ExtensionSet::MessageSetByteSize(ExtensionSet *this)

{
  ExtensionSet *unaff_retaddr;
  anon_class_8_1_736c71da in_stack_00000008;
  size_t total_size;
  
  ForEach<google::protobuf::internal::ExtensionSet::MessageSetByteSize()const::__0>
            (unaff_retaddr,in_stack_00000008);
  return 0;
}

Assistant:

size_t ExtensionSet::MessageSetByteSize() const {
  size_t total_size = 0;
  ForEach([&total_size](int number, const Extension& ext) {
    total_size += ext.MessageSetItemByteSize(number);
  });
  return total_size;
}